

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_packusdw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  int iVar1;
  undefined2 local_60;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  ZMMReg r;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  r._q_ZMMReg[7] = (uint64_t)s;
  s_local = d;
  d_local = (ZMMReg *)env;
  iVar1 = satuw(d->_l_ZMMReg[0]);
  local_60 = (undefined2)iVar1;
  iVar1 = satuw(s_local->_l_ZMMReg[1]);
  local_5e = (undefined2)iVar1;
  iVar1 = satuw(s_local->_l_ZMMReg[2]);
  local_5c = (undefined2)iVar1;
  iVar1 = satuw(s_local->_l_ZMMReg[3]);
  local_5a = (undefined2)iVar1;
  iVar1 = satuw(*(int *)r._q_ZMMReg[7]);
  r._w_ZMMReg[0] = (uint16_t)iVar1;
  iVar1 = satuw(*(int *)(r._q_ZMMReg[7] + 4));
  r._w_ZMMReg[1] = (uint16_t)iVar1;
  iVar1 = satuw(*(int *)(r._q_ZMMReg[7] + 8));
  r._w_ZMMReg[2] = (uint16_t)iVar1;
  iVar1 = satuw(*(int *)(r._q_ZMMReg[7] + 0xc));
  r._w_ZMMReg[3] = (uint16_t)iVar1;
  memcpy(s_local,&local_60,0x40);
  return;
}

Assistant:

void glue(helper_packusdw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    Reg r;

    r.W(0) = satuw((int32_t) d->L(0));
    r.W(1) = satuw((int32_t) d->L(1));
    r.W(2) = satuw((int32_t) d->L(2));
    r.W(3) = satuw((int32_t) d->L(3));
    r.W(4) = satuw((int32_t) s->L(0));
    r.W(5) = satuw((int32_t) s->L(1));
    r.W(6) = satuw((int32_t) s->L(2));
    r.W(7) = satuw((int32_t) s->L(3));
    *d = r;
}